

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Resupply_Received_PDU::Resupply_Received_PDU(Resupply_Received_PDU *this)

{
  Resupply_Received_PDU *this_local;
  
  Logistics_Header::Logistics_Header(&this->super_Logistics_Header);
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Resupply_Received_PDU_0032ff40;
  this->m_ui8NumSupplyTypes = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::vector
            (&this->m_vSupplies);
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui8PDUType = '\a';
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui16PDULength = 0x1c;
  return;
}

Assistant:

Resupply_Received_PDU::Resupply_Received_PDU() :
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 ),
    m_ui8NumSupplyTypes( 0 )
{
    m_ui8PDUType = Resupply_Received_PDU_Type;
    m_ui16PDULength = RESUPPLY_RECEIVED_PDU_SIZE;
}